

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_algorithm.cpp
# Opt level: O2

void show_input_word_summary(void)

{
  _Self __tmp_1;
  _Self __tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  word_set;
  string input;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  word_map;
  
  std::operator<<((ostream *)&std::cout,"Enter words (enter quit to quit):\n");
}

Assistant:

std::string & toLowerCase(std::string & str) {
    std::transform(str.begin(), str.end(), str.begin(), toLower);
    return str;
}